

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_type sVar13;
  size_t sVar14;
  size_type sVar15;
  int iVar16;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00196d00;
  uVar2 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.macroName.m_start + 4);
  sVar13 = (param_1->assertionResult).m_info.macroName.m_size;
  uVar3 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.macroName.m_size + 4);
  uVar4 = *(undefined4 *)&(param_1->assertionResult).m_info.lineInfo.file;
  uVar5 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.lineInfo.file + 4);
  sVar14 = (param_1->assertionResult).m_info.lineInfo.line;
  uVar6 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.lineInfo.line + 4);
  uVar7 = *(undefined4 *)&(param_1->assertionResult).m_info.capturedExpression.m_start;
  uVar8 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.capturedExpression.m_start + 4);
  sVar15 = (param_1->assertionResult).m_info.capturedExpression.m_size;
  uVar9 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start =
       *(undefined4 *)&(param_1->assertionResult).m_info.macroName.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar2;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar13;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar3;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar4;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar5;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar14;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar6;
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start = uVar7;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar8;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar15;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar9;
  uVar2 = *(undefined4 *)&(param_1->assertionResult).m_info.field_0x34;
  (this->assertionResult).m_info.resultDisposition =
       (param_1->assertionResult).m_info.resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar2;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar1 = (param_1->assertionResult).m_resultData.message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar1,
             pcVar1 + (param_1->assertionResult).m_resultData.message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar1 = (param_1->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar1,
             pcVar1 + (param_1->assertionResult).m_resultData.reconstructedExpression.
                      _M_string_length);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (ITransientExpression *)0x0;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated =
       (param_1->assertionResult).m_resultData.lazyExpression.m_isNegated;
  (this->assertionResult).m_resultData.resultType =
       (param_1->assertionResult).m_resultData.resultType;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  (this->totals).testCases.failedButOk = (param_1->totals).testCases.failedButOk;
  iVar16 = (param_1->totals).error;
  uVar2 = *(undefined4 *)&(param_1->totals).field_0x4;
  sVar14 = (param_1->totals).assertions.passed;
  sVar10 = (param_1->totals).assertions.failed;
  sVar11 = (param_1->totals).assertions.failedButOk;
  sVar12 = (param_1->totals).testCases.failed;
  (this->totals).testCases.passed = (param_1->totals).testCases.passed;
  (this->totals).testCases.failed = sVar12;
  (this->totals).assertions.failed = sVar10;
  (this->totals).assertions.failedButOk = sVar11;
  (this->totals).error = iVar16;
  *(undefined4 *)&(this->totals).field_0x4 = uVar2;
  (this->totals).assertions.passed = sVar14;
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;